

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O0

DdNode * addMMRecur(DdManager *dd,DdNode *A,DdNode *B,int topP,int *vars)

{
  DdManager *pDVar1;
  DdNode *pDVar2;
  DdManager *g;
  DdManager *local_e0;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  DdNode *tmp;
  DD_CTFP cacheOp;
  uint topV;
  uint topB;
  uint topA;
  double value;
  double dStack_98;
  int index;
  double scale;
  DdManager *pDStack_88;
  int i;
  DdNode *res;
  DdNode *add_scale;
  DdNode *scaled;
  DdNode *e;
  DdNode *t;
  DdNode *Be;
  DdNode *Bt;
  DdNode *Ae;
  DdNode *At;
  DdNode *zero;
  int *vars_local;
  DdNode *pDStack_28;
  int topP_local;
  DdNode *B_local;
  DdNode *A_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)dd->zero;
  if (((DdManager *)A != dd_local) && ((DdManager *)B != dd_local)) {
    if ((A->index == 0x7fffffff) && (B->index == 0x7fffffff)) {
      _topB = (A->type).value * (B->type).value;
      for (scale._4_4_ = 0; scale._4_4_ < dd->size; scale._4_4_ = scale._4_4_ + 1) {
        if ((vars[scale._4_4_] != 0) && (topP < dd->perm[scale._4_4_])) {
          _topB = _topB * 2.0;
        }
      }
      dd_local = (DdManager *)cuddUniqueConst(dd,_topB);
    }
    else {
      pDStack_28 = B;
      B_local = A;
      if (B < A) {
        pDStack_28 = A;
        B_local = B;
      }
      if (B_local->index == 0x7fffffff) {
        local_cc = B_local->index;
      }
      else {
        local_cc = dd->perm[B_local->index];
      }
      if (pDStack_28->index == 0x7fffffff) {
        local_d0 = pDStack_28->index;
      }
      else {
        local_d0 = dd->perm[pDStack_28->index];
      }
      if (local_d0 < local_cc) {
        local_d4 = local_d0;
      }
      else {
        local_d4 = local_cc;
      }
      pDVar1 = (DdManager *)cuddCacheLookup2(dd,addMMRecur,B_local,pDStack_28);
      if (pDVar1 == (DdManager *)0x0) {
        if (local_d4 == local_cc) {
          Ae = (B_local->type).kids.T;
          Bt = (B_local->type).kids.E;
        }
        else {
          Bt = B_local;
          Ae = B_local;
        }
        if (local_d4 == local_d0) {
          Be = (pDStack_28->type).kids.T;
          t = (pDStack_28->type).kids.E;
        }
        else {
          t = pDStack_28;
          Be = pDStack_28;
        }
        pDVar1 = (DdManager *)addMMRecur(dd,Ae,Be,local_d4,vars);
        if (pDVar1 == (DdManager *)0x0) {
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          g = (DdManager *)addMMRecur(dd,Bt,t,local_d4,vars);
          if (g == (DdManager *)0x0) {
            Cudd_RecursiveDeref(dd,(DdNode *)pDVar1);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + 1;
            if (vars[dd->invperm[local_d4]] == 0) {
              local_e0 = pDVar1;
              if (pDVar1 != g) {
                local_e0 = (DdManager *)
                           cuddUniqueInter(dd,dd->invperm[local_d4],(DdNode *)pDVar1,(DdNode *)g);
              }
              pDStack_88 = local_e0;
              if (local_e0 == (DdManager *)0x0) {
                Cudd_RecursiveDeref(dd,(DdNode *)pDVar1);
                Cudd_RecursiveDeref(dd,(DdNode *)g);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)local_e0 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)local_e0 & 0xfffffffffffffffe) + 4) + 1;
              *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
              *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + -1;
            }
            else {
              pDStack_88 = (DdManager *)
                           cuddAddApplyRecur(dd,Cudd_addPlus,(DdNode *)pDVar1,(DdNode *)g);
              if (pDStack_88 == (DdManager *)0x0) {
                Cudd_RecursiveDeref(dd,(DdNode *)pDVar1);
                Cudd_RecursiveDeref(dd,(DdNode *)g);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)pDStack_88 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDStack_88 & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDeref(dd,(DdNode *)pDVar1);
              Cudd_RecursiveDeref(dd,(DdNode *)g);
            }
            cuddCacheInsert2(dd,addMMRecur,B_local,pDStack_28,&pDStack_88->sentinel);
            if (pDStack_88 != dd_local) {
              dStack_98 = 1.0;
              for (scale._4_4_ = 0; scale._4_4_ < dd->size; scale._4_4_ = scale._4_4_ + 1) {
                if (((vars[scale._4_4_] != 0) && (topP < dd->perm[scale._4_4_])) &&
                   ((uint)dd->perm[scale._4_4_] < local_d4)) {
                  dStack_98 = dStack_98 * 2.0;
                }
              }
              if (1.0 < dStack_98) {
                pDVar2 = cuddUniqueConst(dd,dStack_98);
                if (pDVar2 == (DdNode *)0x0) {
                  Cudd_RecursiveDeref(dd,&pDStack_88->sentinel);
                  return (DdNode *)0x0;
                }
                *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
                pDVar1 = (DdManager *)
                         cuddAddApplyRecur(dd,Cudd_addTimes,&pDStack_88->sentinel,pDVar2);
                if (pDVar1 == (DdManager *)0x0) {
                  Cudd_RecursiveDeref(dd,&pDStack_88->sentinel);
                  Cudd_RecursiveDeref(dd,pDVar2);
                  return (DdNode *)0x0;
                }
                *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
                Cudd_RecursiveDeref(dd,pDVar2);
                Cudd_RecursiveDeref(dd,&pDStack_88->sentinel);
                pDStack_88 = pDVar1;
              }
            }
            *(int *)(((ulong)pDStack_88 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDStack_88 & 0xfffffffffffffffe) + 4) + -1;
            dd_local = pDStack_88;
          }
        }
      }
      else {
        if (pDVar1 == dd_local) {
          return &pDVar1->sentinel;
        }
        dStack_98 = 1.0;
        for (scale._4_4_ = 0; scale._4_4_ < dd->size; scale._4_4_ = scale._4_4_ + 1) {
          if (((vars[scale._4_4_] != 0) && (topP < dd->perm[scale._4_4_])) &&
             ((uint)dd->perm[scale._4_4_] < local_d4)) {
            dStack_98 = dStack_98 * 2.0;
          }
        }
        pDStack_88 = pDVar1;
        if (1.0 < dStack_98) {
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          pDVar2 = cuddUniqueConst(dd,dStack_98);
          if (pDVar2 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,(DdNode *)pDVar1);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
          pDStack_88 = (DdManager *)cuddAddApplyRecur(dd,Cudd_addTimes,(DdNode *)pDVar1,pDVar2);
          if (pDStack_88 == (DdManager *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar2);
            Cudd_RecursiveDeref(dd,(DdNode *)pDVar1);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDStack_88 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDStack_88 & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,pDVar2);
          Cudd_RecursiveDeref(dd,(DdNode *)pDVar1);
          *(int *)(((ulong)pDStack_88 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDStack_88 & 0xfffffffffffffffe) + 4) + -1;
        }
        dd_local = pDStack_88;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
addMMRecur(
  DdManager * dd,
  DdNode * A,
  DdNode * B,
  int  topP,
  int * vars)
{
    DdNode *zero,
           *At,         /* positive cofactor of first operand */
           *Ae,         /* negative cofactor of first operand */
           *Bt,         /* positive cofactor of second operand */
           *Be,         /* negative cofactor of second operand */
           *t,          /* positive cofactor of result */
           *e,          /* negative cofactor of result */
           *scaled,     /* scaled result */
           *add_scale,  /* ADD representing the scaling factor */
           *res;
    int i;              /* loop index */
    double scale;       /* scaling factor */
    int index;          /* index of the top variable */
    CUDD_VALUE_TYPE value;
    unsigned int topA, topB, topV;
    DD_CTFP cacheOp;

    statLine(dd);
    zero = DD_ZERO(dd);

    if (A == zero || B == zero) {
        return(zero);
    }

    if (cuddIsConstant(A) && cuddIsConstant(B)) {
        /* Compute the scaling factor. It is 2^k, where k is the
        ** number of summation variables below the current variable.
        ** Indeed, these constants represent blocks of 2^k identical
        ** constant values in both A and B.
        */
        value = cuddV(A) * cuddV(B);
        for (i = 0; i < dd->size; i++) {
            if (vars[i]) {
                if (dd->perm[i] > topP) {
                    value *= (CUDD_VALUE_TYPE) 2;
                }
            }
        }
        res = cuddUniqueConst(dd, value);
        return(res);
    }

    /* Standardize to increase cache efficiency. Clearly, A*B != B*A
    ** in matrix multiplication. However, which matrix is which is
    ** determined by the variables appearing in the ADDs and not by
    ** which one is passed as first argument.
    */
    if (A > B) {
        DdNode *tmp = A;
        A = B;
        B = tmp;
    }

    topA = cuddI(dd,A->index); topB = cuddI(dd,B->index);
    topV = ddMin(topA,topB);

    cacheOp = (DD_CTFP) addMMRecur;
    res = cuddCacheLookup2(dd,cacheOp,A,B);
    if (res != NULL) {
        /* If the result is 0, there is no need to normalize.
        ** Otherwise we count the number of z variables between
        ** the current depth and the top of the ADDs. These are
        ** the missing variables that determine the size of the
        ** constant blocks.
        */
        if (res == zero) return(res);
        scale = 1.0;
        for (i = 0; i < dd->size; i++) {
            if (vars[i]) {
                if (dd->perm[i] > topP && (unsigned) dd->perm[i] < topV) {
                    scale *= 2;
                }
            }
        }
        if (scale > 1.0) {
            cuddRef(res);
            add_scale = cuddUniqueConst(dd,(CUDD_VALUE_TYPE)scale);
            if (add_scale == NULL) {
                Cudd_RecursiveDeref(dd, res);
                return(NULL);
            }
            cuddRef(add_scale);
            scaled = cuddAddApplyRecur(dd,Cudd_addTimes,res,add_scale);
            if (scaled == NULL) {
                Cudd_RecursiveDeref(dd, add_scale);
                Cudd_RecursiveDeref(dd, res);
                return(NULL);
            }
            cuddRef(scaled);
            Cudd_RecursiveDeref(dd, add_scale);
            Cudd_RecursiveDeref(dd, res);
            res = scaled;
            cuddDeref(res);
        }
        return(res);
    }

    /* compute the cofactors */
    if (topV == topA) {
        At = cuddT(A);
        Ae = cuddE(A);
    } else {
        At = Ae = A;
    }
    if (topV == topB) {
        Bt = cuddT(B);
        Be = cuddE(B);
    } else {
        Bt = Be = B;
    }

    t = addMMRecur(dd, At, Bt, (int)topV, vars);
    if (t == NULL) return(NULL);
    cuddRef(t);
    e = addMMRecur(dd, Ae, Be, (int)topV, vars);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd, t);
        return(NULL);
    }
    cuddRef(e);

    index = dd->invperm[topV];
    if (vars[index] == 0) {
        /* We have split on either the rows of A or the columns
        ** of B. We just need to connect the two subresults,
        ** which correspond to two submatrices of the result.
        */
        res = (t == e) ? t : cuddUniqueInter(dd,index,t,e);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, t);
            Cudd_RecursiveDeref(dd, e);
            return(NULL);
        }
        cuddRef(res);
        cuddDeref(t);
        cuddDeref(e);
    } else {
        /* we have simultaneously split on the columns of A and
        ** the rows of B. The two subresults must be added.
        */
        res = cuddAddApplyRecur(dd,Cudd_addPlus,t,e);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, t);
            Cudd_RecursiveDeref(dd, e);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDeref(dd, t);
        Cudd_RecursiveDeref(dd, e);
    }

    cuddCacheInsert2(dd,cacheOp,A,B,res);

    /* We have computed (and stored in the computed table) a minimal
    ** result; that is, a result that assumes no summation variables
    ** between the current depth of the recursion and its top
    ** variable. We now take into account the z variables by properly
    ** scaling the result.
    */
    if (res != zero) {
        scale = 1.0;
        for (i = 0; i < dd->size; i++) {
            if (vars[i]) {
                if (dd->perm[i] > topP && (unsigned) dd->perm[i] < topV) {
                    scale *= 2;
                }
            }
        }
        if (scale > 1.0) {
            add_scale = cuddUniqueConst(dd,(CUDD_VALUE_TYPE)scale);
            if (add_scale == NULL) {
                Cudd_RecursiveDeref(dd, res);
                return(NULL);
            }
            cuddRef(add_scale);
            scaled = cuddAddApplyRecur(dd,Cudd_addTimes,res,add_scale);
            if (scaled == NULL) {
                Cudd_RecursiveDeref(dd, res);
                Cudd_RecursiveDeref(dd, add_scale);
                return(NULL);
            }
            cuddRef(scaled);
            Cudd_RecursiveDeref(dd, add_scale);
            Cudd_RecursiveDeref(dd, res);
            res = scaled;
        }
    }
    cuddDeref(res);
    return(res);

}